

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  QName *pQVar4;
  XMLCh *pXVar5;
  bool bVar6;
  MemoryManager *pMVar7;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this;
  SchemaElementDecl **ppSVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  XMLSize_t getAt;
  ulong uVar11;
  XMLCh *key1;
  ElemVector *data;
  int key2;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLCh *local_58;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *local_50;
  uint local_48 [2];
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  bVar6 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar6) {
    XSerializeEngine::readSize(serEng,&local_38);
    if (*objToLoad ==
        (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
         *)0x0) {
      pMVar7 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              *)XMemory::operator_new(0x30,pMVar7);
      pMVar7 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar7;
      this->fAdoptedElems = toAdopt;
      this->fBucketList =
           (RefHash2KeysTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
            **)0x0;
      this->fHashModulus = local_38;
      this->fCount = 0;
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::initialize(this,local_38);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar11 = 0;
      do {
        XSerializeEngine::readString
                  (serEng,&local_58,(XMLSize_t *)&local_50,(XMLSize_t *)local_48,false);
        XSerializeEngine::operator>>(serEng,(int *)local_48);
        local_50 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0;
        loadObject(&local_50,8,false,serEng);
        XVar3 = local_50->fCurCount;
        if (XVar3 != 0) {
          getAt = 0;
          do {
            ppSVar8 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt(local_50,getAt);
            pQVar4 = ((*ppSVar8)->fSubstitutionGroupElem->super_XMLElementDecl).fElementName;
            pXVar5 = pQVar4->fLocalPart;
            bVar6 = true;
            if (pXVar5 != local_58) {
              pXVar9 = local_58;
              pXVar10 = pXVar5;
              if (local_58 == (XMLCh *)0x0 || pXVar5 == (XMLCh *)0x0) {
                if (pXVar5 == (XMLCh *)0x0) {
                  if (local_58 != (XMLCh *)0x0) goto LAB_002d6a66;
                }
                else {
                  bVar6 = *pXVar5 == L'\0';
                  if ((local_58 != (XMLCh *)0x0) && (*pXVar5 == L'\0')) {
LAB_002d6a66:
                    bVar6 = *pXVar9 == L'\0';
                  }
                }
              }
              else {
                do {
                  XVar1 = *pXVar10;
                  if (XVar1 == L'\0') goto LAB_002d6a66;
                  XVar2 = *pXVar9;
                  pXVar9 = pXVar9 + 1;
                  pXVar10 = pXVar10 + 1;
                } while (XVar1 == XVar2);
                bVar6 = false;
              }
            }
            if ((bVar6) && (pQVar4->fURIId == local_48[0])) {
              pMVar7 = XSerializeEngine::getMemoryManager(serEng);
              (*pMVar7->_vptr_MemoryManager[4])(pMVar7,local_58);
              local_58 = pXVar5;
              break;
            }
            getAt = getAt + 1;
          } while (getAt != XVar3);
        }
        RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        ::put(*objToLoad,local_58,local_48[0],local_50);
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash2KeysTableOf<ElemVector>**      objToLoad
                                   , int
                                   , bool                                    toAdopt
                                   , XSerializeEngine&                       serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash2KeysTableOf<ElemVector>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLCh*      key1;
            serEng.readString(key1);

            int         key2;
            serEng>>key2;

            ElemVector*  data = 0;

            //don't call destructor
            loadObject(&data, 8, false, serEng);

            /***
             *
             *  There must be one element in the vector whose
             *  susbititutionGroupElem matches the (key1,key2)
             *
             ***/

            // bool FOUND=false;

            XMLSize_t vectorSize = data->size();
            for ( XMLSize_t i = 0; i < vectorSize; i++)
            {
                SchemaElementDecl*& elem   = data->elementAt(i);
                SchemaElementDecl*  subElem = elem->getSubstitutionGroupElem();
                XMLCh* elemName = subElem->getBaseName();
                int    uri      = subElem->getURI();
                if (XMLString::equals(elemName, key1) &&
                    (uri == key2)                       )
                {
                    //release the temp
                    serEng.getMemoryManager()->deallocate(key1);
                    key1 = elemName;
                    //FOUND=true;
                    break;
                }
            }

            /***
             * if (!FOUND)
             * {
             *     throw exception
             * }
             ***/

            (*objToLoad)->put((void*)key1, key2, data);

        }

    }
}